

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d *
tinyusdz::trs_rot_axis
          (matrix4d *__return_storage_ptr__,double3 *translation,double3 *rotation_x_axis,
          double3 *rotation_y_axis,double3 *rotation_z_axis,double3 *scale)

{
  const_reference pvVar1;
  matrix4d *m;
  matrix4d local_338;
  matrix4d local_2b8;
  undefined1 local_238 [8];
  matrix4d sMat;
  matrix4d tMat;
  matrix4d orMat;
  undefined1 auStack_b0 [7];
  bool result_valid;
  matrix4d rMat;
  double3 *scale_local;
  double3 *rotation_z_axis_local;
  double3 *rotation_y_axis_local;
  double3 *rotation_x_axis_local;
  double3 *translation_local;
  
  rMat.m[3][3] = (double)scale;
  value::matrix4d::identity();
  value::matrix4d::identity();
  pvVar1 = std::array<double,_3UL>::operator[](rotation_x_axis,0);
  _auStack_b0 = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_x_axis,1);
  rMat.m[0][0] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_x_axis,2);
  rMat.m[0][1] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_y_axis,0);
  rMat.m[0][3] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_y_axis,1);
  rMat.m[1][0] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_y_axis,2);
  rMat.m[1][1] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_z_axis,0);
  rMat.m[1][3] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_z_axis,1);
  rMat.m[2][0] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](rotation_z_axis,2);
  rMat.m[2][1] = *pvVar1;
  orMat.m[3][3]._7_1_ = 1;
  orthonormalize((matrix4d *)(tMat.m[3] + 3),(matrix4d *)auStack_b0,
                 (bool *)((long)orMat.m[3] + 0x1f));
  value::matrix4d::identity();
  pvVar1 = std::array<double,_3UL>::operator[](translation,0);
  tMat.m[2][3] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](translation,1);
  tMat.m[3][0] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[](translation,2);
  tMat.m[3][1] = *pvVar1;
  value::matrix4d::identity();
  pvVar1 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)rMat.m[3][3],0);
  local_238 = (undefined1  [8])*pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)rMat.m[3][3],1);
  sMat.m[1][0] = *pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)rMat.m[3][3],2);
  sMat.m[2][1] = *pvVar1;
  value::operator*(&local_338,(matrix4d *)local_238,(matrix4d *)(tMat.m[3] + 3));
  value::operator*(&local_2b8,&local_338,(matrix4d *)(sMat.m[3] + 3));
  memcpy(__return_storage_ptr__,&local_2b8,0x80);
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d trs_rot_axis(const value::double3 &translation,
                             const value::double3 &rotation_x_axis,
                             const value::double3 &rotation_y_axis,
                             const value::double3 &rotation_z_axis,
                             const value::double3 &scale) {
  value::matrix4d m{value::matrix4d::identity()};

  value::matrix4d rMat{value::matrix4d::identity()};
  rMat.m[0][0] = rotation_x_axis[0];
  rMat.m[0][1] = rotation_x_axis[1];
  rMat.m[0][2] = rotation_x_axis[2];
  rMat.m[1][0] = rotation_y_axis[0];
  rMat.m[1][1] = rotation_y_axis[1];
  rMat.m[1][2] = rotation_y_axis[2];
  rMat.m[2][0] = rotation_z_axis[0];
  rMat.m[2][1] = rotation_z_axis[1];
  rMat.m[2][2] = rotation_z_axis[2];

  bool result_valid{true};
  value::matrix4d orMat = orthonormalize(rMat, &result_valid);
  // TODO: report error when orthonormalize failed.

  value::matrix4d tMat{value::matrix4d::identity()};
  tMat.m[3][0] = translation[0];
  tMat.m[3][1] = translation[1];
  tMat.m[3][2] = translation[2];

  value::matrix4d sMat{value::matrix4d::identity()};
  sMat.m[0][0] = scale[0];
  sMat.m[1][1] = scale[1];
  sMat.m[2][2] = scale[2];

  m = sMat * orMat * tMat;

  return m;
}